

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

string * __thiscall
cmServerResponse::ErrorMessage_abi_cxx11_(string *__return_storage_ptr__,cmServerResponse *this)

{
  if (this->m_Payload == PAYLOAD_ERROR) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_ErrorMessage);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmServerResponse::ErrorMessage() const
{
  if (this->m_Payload == PAYLOAD_ERROR) {
    return this->m_ErrorMessage;
  }
  return std::string();
}